

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall btMultiBodyDynamicsWorld::calculateSimulationIslands(btMultiBodyDynamicsWorld *this)

{
  btSimulationIslandManager *pbVar1;
  btPersistentManifold *pbVar2;
  btCollisionObject *pbVar3;
  btCollisionObject *pbVar4;
  btTypedConstraint *pbVar5;
  btMultiBody *pbVar6;
  btMultiBodyLinkCollider *pbVar7;
  btMultiBodyConstraint *pbVar8;
  uint uVar9;
  uint q;
  int b;
  long lVar10;
  long lVar11;
  int i;
  long lVar12;
  ulong uVar13;
  btMultiBodyLinkCollider *pbVar14;
  int i_1;
  ulong uVar15;
  CProfileSample __profile;
  CProfileSample local_39;
  long local_38;
  
  CProfileManager::Start_Profile("calculateSimulationIslands");
  pbVar1 = (this->super_btDiscreteDynamicsWorld).m_islandManager;
  (*pbVar1->_vptr_btSimulationIslandManager[2])
            (pbVar1,this,
             (this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
             m_dispatcher1);
  for (lVar12 = 0; lVar12 < (this->super_btDiscreteDynamicsWorld).m_predictiveManifolds.m_size;
      lVar12 = lVar12 + 1) {
    pbVar2 = (this->super_btDiscreteDynamicsWorld).m_predictiveManifolds.m_data[lVar12];
    pbVar3 = pbVar2->m_body0;
    if (((pbVar3 != (btCollisionObject *)0x0) &&
        (pbVar4 = pbVar2->m_body1, pbVar4 != (btCollisionObject *)0x0)) &&
       (((pbVar3->m_collisionFlags & 3U) == 0 && ((pbVar4->m_collisionFlags & 3) == 0)))) {
      btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                         pbVar3->m_islandTag1,pbVar4->m_islandTag1);
    }
  }
  uVar9 = (this->super_btDiscreteDynamicsWorld).m_constraints.m_size;
  uVar15 = 0;
  uVar13 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar13 = uVar15;
  }
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    pbVar5 = (this->super_btDiscreteDynamicsWorld).m_constraints.m_data[uVar15];
    if (((pbVar5->m_isEnabled == true) &&
        (((pbVar5->m_rbA->super_btCollisionObject).m_collisionFlags & 3) == 0)) &&
       (((pbVar5->m_rbB->super_btCollisionObject).m_collisionFlags & 3) == 0)) {
      btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                         (pbVar5->m_rbA->super_btCollisionObject).m_islandTag1,
                         (pbVar5->m_rbB->super_btCollisionObject).m_islandTag1);
    }
  }
  lVar12 = 0;
  do {
    if ((this->m_multiBodies).m_size <= lVar12) {
      for (lVar12 = 0; lVar12 < (this->m_multiBodyConstraints).m_size; lVar12 = lVar12 + 1) {
        pbVar8 = (this->m_multiBodyConstraints).m_data[lVar12];
        uVar9 = (*pbVar8->_vptr_btMultiBodyConstraint[3])(pbVar8);
        q = (*pbVar8->_vptr_btMultiBodyConstraint[4])(pbVar8);
        if (-1 < (int)(q | uVar9)) {
          btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind,
                             uVar9,q);
        }
      }
      pbVar1 = (this->super_btDiscreteDynamicsWorld).m_islandManager;
      (*pbVar1->_vptr_btSimulationIslandManager[3])(pbVar1,this);
      CProfileSample::~CProfileSample(&local_39);
      return;
    }
    pbVar6 = (this->m_multiBodies).m_data[lVar12];
    pbVar14 = pbVar6->m_baseCollider;
    lVar11 = 0x1e8;
    local_38 = lVar12;
    for (lVar10 = 0; lVar10 < (pbVar6->m_links).m_size; lVar10 = lVar10 + 1) {
      pbVar7 = *(btMultiBodyLinkCollider **)
                ((long)(((pbVar6->m_links).m_data)->m_inertiaLocal).m_floats + lVar11 + -4);
      if (pbVar7 != (btMultiBodyLinkCollider *)0x0) {
        uVar9 = *(uint *)(pbVar7 + 0xe0) & 3;
        if ((uVar9 == 0) && (pbVar14 != (btMultiBodyLinkCollider *)0x0)) {
          if (((byte)pbVar14[0xe0] & 3) == 0) {
            btUnionFind::unite(&((this->super_btDiscreteDynamicsWorld).m_islandManager)->m_unionFind
                               ,*(int *)(pbVar14 + 0xe4),*(int *)(pbVar7 + 0xe4));
            uVar9 = *(uint *)(pbVar7 + 0xe0) & 3;
            goto LAB_0018f413;
          }
        }
        else {
LAB_0018f413:
          if (uVar9 != 0) goto LAB_0018f41a;
        }
        pbVar14 = pbVar7;
      }
LAB_0018f41a:
      lVar11 = lVar11 + 600;
    }
    lVar12 = local_38 + 1;
  } while( true );
}

Assistant:

void	btMultiBodyDynamicsWorld::calculateSimulationIslands()
{
	BT_PROFILE("calculateSimulationIslands");

	getSimulationIslandManager()->updateActivationState(getCollisionWorld(),getCollisionWorld()->getDispatcher());

    {
        //merge islands based on speculative contact manifolds too
        for (int i=0;i<this->m_predictiveManifolds.size();i++)
        {
            btPersistentManifold* manifold = m_predictiveManifolds[i];
            
            const btCollisionObject* colObj0 = manifold->getBody0();
            const btCollisionObject* colObj1 = manifold->getBody1();
            
            if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
                ((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
            {
				getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
            }
        }
    }
    
	{
		int i;
		int numConstraints = int(m_constraints.size());
		for (i=0;i< numConstraints ; i++ )
		{
			btTypedConstraint* constraint = m_constraints[i];
			if (constraint->isEnabled())
			{
				const btRigidBody* colObj0 = &constraint->getRigidBodyA();
				const btRigidBody* colObj1 = &constraint->getRigidBodyB();

				if (((colObj0) && (!(colObj0)->isStaticOrKinematicObject())) &&
					((colObj1) && (!(colObj1)->isStaticOrKinematicObject())))
				{
					getSimulationIslandManager()->getUnionFind().unite((colObj0)->getIslandTag(),(colObj1)->getIslandTag());
				}
			}
		}
	}

	//merge islands linked by Featherstone link colliders
	for (int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		{
			btMultiBodyLinkCollider* prev = body->getBaseCollider();

			for (int b=0;b<body->getNumLinks();b++)
			{
				btMultiBodyLinkCollider* cur = body->getLink(b).m_collider;
				
				if (((cur) && (!(cur)->isStaticOrKinematicObject())) &&
					((prev) && (!(prev)->isStaticOrKinematicObject())))
				{
					int tagPrev = prev->getIslandTag();
					int tagCur = cur->getIslandTag();
					getSimulationIslandManager()->getUnionFind().unite(tagPrev, tagCur);
				}
				if (cur && !cur->isStaticOrKinematicObject())
					prev = cur;
				
			}
		}
	}

	//merge islands linked by multibody constraints
	{
		for (int i=0;i<this->m_multiBodyConstraints.size();i++)
		{
			btMultiBodyConstraint* c = m_multiBodyConstraints[i];
			int tagA = c->getIslandIdA();
			int tagB = c->getIslandIdB();
			if (tagA>=0 && tagB>=0)
				getSimulationIslandManager()->getUnionFind().unite(tagA, tagB);
		}
	}

	//Store the island id in each body
	getSimulationIslandManager()->storeIslandActivationState(getCollisionWorld());

}